

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr_ipp.hpp
# Opt level: O0

VectorBuffer * __thiscall
duckdb::shared_ptr<duckdb::VectorBuffer,_true>::operator->
          (shared_ptr<duckdb::VectorBuffer,_true> *this)

{
  element_type *peVar1;
  __shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2> *in_RDI;
  element_type *ptr;
  bool in_stack_00000037;
  
  peVar1 = ::std::__shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>::get(in_RDI);
  AssertNotNull(in_stack_00000037);
  return peVar1;
}

Assistant:

T *operator->() const {
		if (MemorySafety<SAFE>::ENABLED) {
			const auto ptr = internal.get();
			AssertNotNull(!ptr);
			return ptr;
		} else {
			return internal.operator->();
		}
	}